

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

LY_ERR lysp_check_dup_features(lysp_ctx *ctx,lysp_module *mod)

{
  LY_ERR LVar1;
  ly_ht *ht;
  lysp_include *plVar2;
  ulong uVar3;
  ulong uVar4;
  lysp_feature *plVar5;
  lysp_feature *plVar6;
  lysp_feature *plVar7;
  
  LVar1 = LY_EMEM;
  ht = lyht_new(8,8,ly_ptrequal_cb,(void *)0x0,1);
  if (ht != (ly_ht *)0x0) {
    plVar7 = mod->features;
    plVar6 = plVar7;
    for (plVar5 = plVar7;
        (plVar6 != (lysp_feature *)0x0 &&
        ((ulong)((long)plVar5 - (long)plVar6) >> 6 < *(ulong *)&plVar6[-1].flags));
        plVar5 = plVar5 + 1) {
      LVar1 = lysp_check_dup_ht_insert
                        (ctx,ht,plVar7->name,"feature",
                         "name collision with another top-level feature");
      if (LVar1 != LY_SUCCESS) goto LAB_001606ee;
      plVar7 = plVar7 + 1;
      plVar6 = mod->features;
    }
    plVar2 = mod->includes;
    uVar4 = 0;
    while( true ) {
      if (plVar2 == (lysp_include *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ulong *)(plVar2[-1].rev + 8);
      }
      if (uVar3 <= uVar4) break;
      plVar7 = (plVar2[uVar4].submodule)->features;
      if ((plVar7 != (lysp_feature *)0x0) && (plVar6 = plVar7, *(long *)&plVar7[-1].flags != 0)) {
        do {
          plVar6 = plVar6 + 1;
          LVar1 = lysp_check_dup_ht_insert
                            (ctx,ht,plVar7->name,"feature",
                             "name collision with another top-level feature");
          if (LVar1 != LY_SUCCESS) goto LAB_001606ee;
          plVar2 = mod->includes;
          plVar5 = (plVar2[uVar4].submodule)->features;
        } while ((plVar5 != (lysp_feature *)0x0) &&
                (plVar7 = plVar7 + 1,
                (ulong)((long)plVar6 - (long)plVar5) >> 6 < *(ulong *)&plVar5[-1].flags));
      }
      uVar4 = uVar4 + 1;
    }
    LVar1 = LY_SUCCESS;
LAB_001606ee:
    lyht_free(ht,(_func_void_void_ptr *)0x0);
  }
  return LVar1;
}

Assistant:

LY_ERR
lysp_check_dup_features(struct lysp_ctx *ctx, struct lysp_module *mod)
{
    LY_ARRAY_COUNT_TYPE u;
    struct ly_ht *ht;
    struct lysp_feature *f;
    LY_ERR ret = LY_SUCCESS;

    ht = lyht_new(LYHT_MIN_SIZE, sizeof(void *), ly_ptrequal_cb, NULL, 1);
    LY_CHECK_RET(!ht, LY_EMEM);

    /* add all module features into a hash table */
    LY_ARRAY_FOR(mod->features, struct lysp_feature, f) {
        ret = lysp_check_dup_ht_insert(ctx, ht, f->name, "feature",
                "name collision with another top-level feature");
        LY_CHECK_GOTO(ret, cleanup);
    }

    /* add all submodule features into a hash table */
    LY_ARRAY_FOR(mod->includes, u) {
        LY_ARRAY_FOR(mod->includes[u].submodule->features, struct lysp_feature, f) {
            ret = lysp_check_dup_ht_insert(ctx, ht, f->name, "feature",
                    "name collision with another top-level feature");
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyht_free(ht, NULL);
    return ret;
}